

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

optional<std::pair<CNetMessage,_bool>_> * __thiscall
CNode::PollMessage(optional<std::pair<CNetMessage,_bool>_> *__return_storage_ptr__,CNode *this)

{
  list<CNetMessage,_std::allocator<CNetMessage>_> *__offin;
  _List_node_base *p_Var1;
  ulong uVar2;
  __off64_t *__offout;
  size_t __len;
  long in_FS_OFFSET;
  list<CNetMessage,_std::allocator<CNetMessage>_> msgs;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock102;
  uint in_stack_ffffffffffffff48;
  _List_node_base local_b0;
  undefined8 local_a0;
  unique_lock<std::mutex> local_98;
  pair<CNetMessage,_bool> local_88;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __offout = (__off64_t *)0xee8;
  __len = 0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_98,&this->m_msg_process_queue_mutex,
             "m_msg_process_queue_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0xee8,false);
  __offin = &this->m_msg_process_queue;
  p_Var1 = (this->m_msg_process_queue).super__List_base<CNetMessage,_std::allocator<CNetMessage>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var1 == (_List_node_base *)__offin) {
    (__return_storage_ptr__->super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>).
    _M_payload.super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
    super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_engaged = false;
  }
  else {
    local_a0 = 0;
    local_b0._M_next = &local_b0;
    local_b0._M_prev = &local_b0;
    std::__cxx11::list<CNetMessage,_std::allocator<CNetMessage>_>::splice
              ((list<CNetMessage,_std::allocator<CNetMessage>_> *)&local_b0,(int)&local_b0,
               (__off64_t *)__offin,(int)p_Var1,__offout,__len,in_stack_ffffffffffffff48);
    uVar2 = this->m_msg_process_queue_size -
            (ulong)*(uint *)((long)&local_b0._M_next[3]._M_prev + 4);
    this->m_msg_process_queue_size = uVar2;
    LOCK();
    (this->fPauseRecv)._M_base._M_i = this->m_recv_flood_size < uVar2;
    UNLOCK();
    p_Var1 = (this->m_msg_process_queue).super__List_base<CNetMessage,_std::allocator<CNetMessage>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    CNetMessage::CNetMessage(&local_88.first,(CNetMessage *)(local_b0._M_next + 1));
    local_88.second = p_Var1 != (_List_node_base *)__offin;
    std::optional<std::pair<CNetMessage,_bool>_>::optional<std::pair<CNetMessage,_bool>,_true>
              (__return_storage_ptr__,&local_88);
    CNetMessage::~CNetMessage(&local_88.first);
    std::__cxx11::_List_base<CNetMessage,_std::allocator<CNetMessage>_>::_M_clear
              ((_List_base<CNetMessage,_std::allocator<CNetMessage>_> *)&local_b0);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::pair<CNetMessage, bool>> CNode::PollMessage()
{
    LOCK(m_msg_process_queue_mutex);
    if (m_msg_process_queue.empty()) return std::nullopt;

    std::list<CNetMessage> msgs;
    // Just take one message
    msgs.splice(msgs.begin(), m_msg_process_queue, m_msg_process_queue.begin());
    m_msg_process_queue_size -= msgs.front().m_raw_message_size;
    fPauseRecv = m_msg_process_queue_size > m_recv_flood_size;

    return std::make_pair(std::move(msgs.front()), !m_msg_process_queue.empty());
}